

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_raise_exception(TCGContext_conflict2 *tcg_ctx,int nr)

{
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  pTVar1 = tcg_const_i32_m68k(tcg_ctx,nr);
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_m68k(tcg_ctx,helper_raise_exception_m68k,(TCGTemp *)0x0,2,&local_28);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_raise_exception(TCGContext *tcg_ctx, int nr)
{
    TCGv_i32 tmp;

    tmp = tcg_const_i32(tcg_ctx, nr);
    gen_helper_raise_exception(tcg_ctx, tcg_ctx->cpu_env, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
}